

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> __thiscall
duckdb::Deserializer::
ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ReservoirChunk,std::default_delete<duckdb::ReservoirChunk>,true>>
          (Deserializer *this,field_id_t field_id,char *tag)

{
  pointer pVVar1;
  int iVar2;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> *ptr;
  undefined6 in_register_00000032;
  Deserializer *deserializer;
  pointer local_20;
  
  deserializer = (Deserializer *)CONCAT62(in_register_00000032,field_id);
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,(ulong)tag & 0xffffffff);
  if ((char)iVar2 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    this->_vptr_Deserializer = (_func_int **)0x0;
  }
  else {
    this->_vptr_Deserializer = (_func_int **)0x0;
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 != '\0') {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ReservoirChunk::Deserialize((ReservoirChunk *)&stack0xffffffffffffffe0,deserializer);
      pVVar1 = local_20;
      local_20 = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
      reset((__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> *
            )this,(pointer)pVVar1);
      pVVar1 = local_20;
      if (local_20 != (pointer)0x0) {
        DataChunk::~DataChunk((DataChunk *)local_20);
        operator_delete(pVVar1);
      }
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  return (unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>)
         (unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>)this;
}

Assistant:

inline T ReadPropertyWithDefault(const field_id_t field_id, const char *tag) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(SerializationDefaultValue::GetDefault<T>());
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}